

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

FIOBJ fiobj_hash_remove2(FIOBJ hash,uint64_t hash_value)

{
  int *piVar1;
  byte bVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x106,"FIOBJ fiobj_hash_remove2(FIOBJ, uint64_t)");
  }
  uVar11 = hash & 0xfffffffffffffff8;
  lVar6 = *(long *)(uVar11 + 0x28);
  if (lVar6 != 0) {
    uVar14 = -(ulong)(hash_value == 0) | hash_value;
    if ((*(char *)(uVar11 + 0x30) != '\0') && (*(long *)(uVar11 + 0x18) != *(long *)(uVar11 + 8))) {
      fio_hash___rehash((fio_hash___s *)(uVar11 + 8));
      lVar6 = *(long *)(uVar11 + 0x28);
    }
    bVar2 = *(byte *)(uVar11 + 0x31);
    uVar10 = ~(-1L << (bVar2 & 0x3f));
    uVar12 = 0;
    if (bVar2 != 0) {
      uVar12 = uVar14;
    }
    uVar12 = uVar12 ^ (uVar14 >> (bVar2 & 0x3f) | uVar14 << 0x40 - (bVar2 & 0x3f));
    lVar7 = (uVar12 & uVar10) * 0x10;
    uVar9 = *(ulong *)(lVar6 + lVar7);
    if (uVar9 == uVar14 || uVar9 == 0) {
      puVar5 = (undefined8 *)(lVar6 + lVar7);
    }
    else {
      uVar9 = 0x420;
      if (*(ulong *)(uVar11 + 0x10) < 0x181) {
        uVar9 = (*(ulong *)(uVar11 + 0x10) >> 2) * 0xb;
      }
      if (uVar9 == 0) {
        return 0;
      }
      uVar13 = 0;
      while( true ) {
        lVar7 = (uVar12 + 0xb + uVar13 & uVar10) * 0x10;
        puVar5 = (undefined8 *)(lVar6 + lVar7);
        uVar4 = *(ulong *)(lVar6 + lVar7);
        if ((uVar4 == 0) || (uVar4 == uVar14)) break;
        uVar13 = uVar13 + 0xb;
        if (uVar9 <= uVar13) {
          return 0;
        }
      }
    }
    lVar6 = puVar5[1];
    if (lVar6 != 0) {
      uVar14 = *(ulong *)(lVar6 + 0x10);
      if ((((~(uint)uVar14 & 6) != 0) && (uVar14 != 0)) && ((uVar14 & 1) == 0)) {
        LOCK();
        piVar1 = (int *)((uVar14 & 0xfffffffffffffff8) + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        lVar6 = puVar5[1];
      }
      fiobj_free(*(FIOBJ *)(lVar6 + 8));
      lVar6 = puVar5[1];
      *(undefined8 *)(lVar6 + 8) = 0;
      fiobj_free(*(FIOBJ *)(lVar6 + 0x10));
      puVar3 = (undefined8 *)puVar5[1];
      puVar3[2] = 0;
      *(long *)(uVar11 + 8) = *(long *)(uVar11 + 8) + -1;
      *puVar3 = 0;
      lVar6 = *(long *)(uVar11 + 0x18);
      lVar7 = *(long *)(uVar11 + 0x20);
      if (puVar3 == (undefined8 *)(lVar7 + lVar6 * 0x18 + -0x18)) {
        *puVar5 = 0;
        plVar8 = (long *)(lVar7 + lVar6 * 0x18 + -0x30);
        do {
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) break;
          lVar7 = *plVar8;
          plVar8 = plVar8 + -3;
        } while (lVar7 == 0);
        *(long *)(uVar11 + 0x18) = lVar6;
      }
      puVar5[1] = 0;
      return uVar14;
    }
  }
  return 0;
}

Assistant:

FIOBJ fiobj_hash_remove2(FIOBJ hash, uint64_t hash_value) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___remove(&obj2hash(hash)->hash, hash_value, -1, &old);
  return old;
}